

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::IntOption::help(IntOption *this,bool verbose)

{
  bool verbose_local;
  IntOption *this_local;
  
  fprintf(_stderr,"  -%-12s = %-8s [",(this->super_Option).name,(this->super_Option).type_name);
  if ((this->range).begin == -0x80000000) {
    fprintf(_stderr,"imin");
  }
  else {
    fprintf(_stderr,"%4d",(ulong)(uint)(this->range).begin);
  }
  fprintf(_stderr," .. ");
  if ((this->range).end == 0x7fffffff) {
    fprintf(_stderr,"imax");
  }
  else {
    fprintf(_stderr,"%4d",(ulong)(uint)(this->range).end);
  }
  fprintf(_stderr,"] (default: %d)\n",(ulong)(uint)this->value);
  if (verbose) {
    fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help (bool verbose = false){
        fprintf(stderr, "  -%-12s = %-8s [", name, type_name);
        if (range.begin == INT32_MIN)
            fprintf(stderr, "imin");
        else
            fprintf(stderr, "%4d", range.begin);

        fprintf(stderr, " .. ");
        if (range.end == INT32_MAX)
            fprintf(stderr, "imax");
        else
            fprintf(stderr, "%4d", range.end);

        fprintf(stderr, "] (default: %d)\n", value);
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }